

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqarray.h
# Opt level: O3

void __thiscall SQArray::Append(SQArray *this,SQObject *o)

{
  SQUnsignedInteger *pSVar1;
  ulong uVar2;
  SQObjectPtr *p;
  SQObjectType SVar3;
  ulong uVar4;
  SQUnsignedInteger SVar5;
  SQObjectPtr local_20;
  
  local_20.super_SQObject._type = o->_type;
  local_20.super_SQObject._unVal = (SQObjectValue)(o->_unVal).pTable;
  SVar3 = local_20.super_SQObject._type & 0x8000000;
  if (SVar3 != 0) {
    pSVar1 = &((local_20.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  uVar2 = (this->_values)._allocated;
  p = (this->_values)._vals;
  uVar4 = (this->_values)._size;
  if (uVar2 <= uVar4) {
    SVar5 = 4;
    if (uVar4 * 2 != 0) {
      SVar5 = uVar4 * 2;
    }
    p = (SQObjectPtr *)sq_vm_realloc(p,uVar2 << 4,SVar5 << 4);
    (this->_values)._vals = p;
    (this->_values)._allocated = SVar5;
    uVar4 = (this->_values)._size;
    SVar3 = local_20.super_SQObject._type & 0x8000000;
  }
  (this->_values)._size = uVar4 + 1;
  p[uVar4].super_SQObject._type = local_20.super_SQObject._type;
  p[uVar4].super_SQObject._unVal.pTable = (SQTable *)local_20.super_SQObject._unVal;
  if (SVar3 != 0) {
    pSVar1 = &((local_20.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  SQObjectPtr::~SQObjectPtr(&local_20);
  return;
}

Assistant:

void Append(const SQObject &o){_values.push_back(o);}